

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

CATNDepartureSet<wchar_t> * __thiscall
Centaurus::CATNDepartureSetFactory<wchar_t>::build_departure_set
          (CATNDepartureSet<wchar_t> *__return_storage_ptr__,CATNDepartureSetFactory<wchar_t> *this)

{
  _Rb_tree_header *p_Var1;
  pointer pCVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pCVar5;
  CATNDeparture<wchar_t> *t;
  _Base_ptr p_Var6;
  IndexVector borders_for_one_tr;
  Range<wchar_t> atomic_range;
  set<int,_std::less<int>,_std::allocator<int>_> borders;
  _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  local_a0;
  Range<wchar_t> local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar2 = (this->m_departures).
           super__Vector_base<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pCVar5 = (this->m_departures).
                super__Vector_base<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar5 != pCVar2; pCVar5 = pCVar5 + 1) {
    CharClass<wchar_t>::collect_borders((IndexVector *)&local_a0,&pCVar5->m_label);
    __first._M_current._4_4_ = local_a0._M_impl.super__Rb_tree_header._M_header._4_4_;
    __first._M_current._0_4_ = local_a0._M_impl.super__Rb_tree_header._M_header._M_color;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_60
               ,__first,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                        local_a0._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_a0._M_impl.super__Rb_tree_header);
  }
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ).
  super__Vector_base<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->_vptr_CATNDepartureSet = (_func_int **)&PTR__CATNDepartureSet_00193438;
  p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var1 = &local_60._M_impl.super__Rb_tree_header, (_Rb_tree_header *)p_Var6 != p_Var1) {
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    if ((_Rb_tree_header *)p_Var4 == p_Var1) break;
    local_70.m_start = p_Var6[1]._M_color;
    local_70.m_end = p_Var4[1]._M_color;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70._vptr_Range = (_func_int **)&PTR__Range_001925b0;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_a0._M_impl.super__Rb_tree_header._M_header;
    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    pCVar2 = (this->m_departures).
             super__Vector_base<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pCVar5 = (this->m_departures).
                  super__Vector_base<Centaurus::CATNDeparture<wchar_t>,_std::allocator<Centaurus::CATNDeparture<wchar_t>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pCVar5 != pCVar2; pCVar5 = pCVar5 + 1)
    {
      bVar3 = CharClass<wchar_t>::includes(&pCVar5->m_label,&local_70);
      if (bVar3) {
        closure_add(this,(CATNClosure *)&local_a0,pCVar5);
      }
    }
    if (local_a0._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::
      vector<std::pair<Centaurus::CharClass<wchar_t>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>,std::allocator<std::pair<Centaurus::CharClass<wchar_t>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>>>
      ::
      emplace_back<Centaurus::Range<wchar_t>&,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>&>
                ((vector<std::pair<Centaurus::CharClass<wchar_t>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>,std::allocator<std::pair<Centaurus::CharClass<wchar_t>,std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>>>>
                  *)&__return_storage_ptr__->
                     super_vector<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<wchar_t>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
                 ,&local_70,
                 (set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
                  *)&local_a0);
    }
    std::
    _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
    ::~_Rb_tree(&local_a0);
    p_Var6 = p_Var4;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

CATNDepartureSet<TCHAR> build_departure_set()
    {
        std::set<int> borders;

        for (const auto& t : m_departures)
        {
            IndexVector borders_for_one_tr = t.label().collect_borders();

            borders.insert(borders_for_one_tr.cbegin(), borders_for_one_tr.cend());
        }

        CATNDepartureSet<TCHAR> deptset;

        for (auto i = borders.cbegin(); i != borders.cend();)
        {
            TCHAR atomic_range_start = *i;
            if (++i == borders.cend()) break;
            TCHAR atomic_range_end = *i;

            Range<TCHAR> atomic_range(atomic_range_start, atomic_range_end);

            CATNClosure closure;

            for (const auto& t : m_departures)
            {
                if (t.label().includes(atomic_range))
                {
                    /*if (!closure.empty())
                    {
                        std::wcerr << L"Closure not empty." << std::endl;
                        std::wcerr << closure << std::endl;
                        std::wcerr << t.priority() << std::endl;
                    }
                    if (scan_closure(closure, t.priority()))
                    {
                        closure.emplace(t.path(), t.color(), t.priority());
                    }
                    else
                    {
                        std::wcerr << L"Departure blocked." << std::endl;
                        std::wcerr << closure << std::endl;
                        std::wcerr << t.priority() << std::endl;
                    }*/
                    closure_add(closure, t);
                }
            }

            if (!closure.empty())
            {
                deptset.emplace_back(atomic_range, closure);
            }
        }
        //std::wcout << deptset << std::endl;
        return deptset;
    }